

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O3

RealType __thiscall OpenMD::Thermo::getElectronicTemperature(Thermo *this)

{
  Snapshot *this_00;
  RealType RVar1;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasElectronicTemperature == false) {
    RVar1 = getElectronicKinetic(this);
    Snapshot::setElectronicTemperature
              (this_00,(RVar1 + RVar1) /
                       ((double)this->info_->nGlobalFluctuatingCharges_ * 0.0019872156));
  }
  RVar1 = Snapshot::getElectronicTemperature(this_00);
  return RVar1;
}

Assistant:

RealType Thermo::getElectronicTemperature() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasElectronicTemperature) {
      RealType eTemp = (2.0 * this->getElectronicKinetic()) /
                       (info_->getNFluctuatingCharges() * Constants::kb);

      snap->setElectronicTemperature(eTemp);
    }

    return snap->getElectronicTemperature();
  }